

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_LBackward
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  long lVar5;
  longdouble lVar6;
  longdouble lVar7;
  complex<long_double> __r;
  complex<long_double> local_b8;
  TPZFMatrix<std::complex<long_double>_> *local_98;
  long local_90;
  TPZMatrix<std::complex<long_double>_> *local_88;
  long local_80;
  undefined4 local_78 [8];
  complex<long_double> local_58;
  
  lVar5 = (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar5 != CONCAT44(extraout_var,iVar3)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LBackward incompatible dimensions \n",(char *)0x0);
  }
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar3) != 0 && -1 < extraout_var_00) {
    local_90 = CONCAT44(extraout_var_00,iVar3);
    local_98 = B;
    local_88 = this;
    do {
      lVar5 = local_90 + -1;
      if (0 < (local_98->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol) {
        local_80 = 0;
        do {
          iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
          lVar2 = local_90;
          lVar4 = CONCAT44(extraout_var_01,iVar3);
          lVar6 = (longdouble)0;
          lVar7 = lVar6;
          if (local_90 < lVar4) {
            lVar6 = (longdouble)0;
            lVar7 = lVar6;
            do {
              lVar4 = lVar4 + -1;
              (*(local_88->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_78,local_88,lVar5,lVar4);
              (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x24])(&local_58,B,lVar4,local_80);
              local_b8._M_value._16_4_ = local_78[4];
              local_b8._M_value._20_4_ = local_78[5];
              local_b8._M_value._24_2_ = SUB42(local_78[6],0);
              local_b8._M_value._26_2_ = SUB42((uint)local_78[6] >> 0x10,0);
              local_b8._M_value._28_4_ = local_78[7];
              local_b8._M_value._0_4_ = local_78[0];
              local_b8._M_value._4_4_ = local_78[1];
              local_b8._M_value._8_2_ = SUB42(local_78[2],0);
              local_b8._M_value._10_2_ = SUB42((uint)local_78[2] >> 0x10,0);
              local_b8._M_value._12_4_ = local_78[3];
              std::complex<long_double>::operator*=(&local_b8,&local_58);
              lVar7 = (longdouble)
                      CONCAT28(local_b8._M_value._8_2_,
                               CONCAT44(local_b8._M_value._4_4_,local_b8._M_value._0_4_)) + lVar7;
              lVar6 = (longdouble)
                      CONCAT28(local_b8._M_value._24_2_,
                               CONCAT44(local_b8._M_value._20_4_,local_b8._M_value._16_4_)) + lVar6;
            } while (lVar2 < lVar4);
          }
          lVar2 = local_80;
          (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(local_78,B,lVar5,local_80);
          local_b8._M_value._8_2_ = SUB42(local_78[2],0);
          local_b8._M_value._10_2_ = SUB42((uint)local_78[2] >> 0x10,0);
          local_b8._M_value._12_4_ = local_78[3];
          local_b8._M_value._24_2_ = SUB42(local_78[6],0);
          local_b8._M_value._26_2_ = SUB42((uint)local_78[6] >> 0x10,0);
          local_b8._M_value._28_4_ = local_78[7];
          lVar7 = (longdouble)CONCAT28(local_b8._M_value._8_2_,CONCAT44(local_78[1],local_78[0])) -
                  lVar7;
          lVar6 = (longdouble)CONCAT28(local_b8._M_value._24_2_,CONCAT44(local_78[5],local_78[4])) -
                  lVar6;
          local_b8._M_value._0_4_ = SUB104(lVar7,0);
          local_b8._M_value._4_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
          local_b8._M_value._8_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
          local_b8._M_value._16_4_ = SUB104(lVar6,0);
          local_b8._M_value._20_4_ = SUB104((unkuint10)lVar6 >> 0x20,0);
          local_b8._M_value._24_2_ = SUB102((unkuint10)lVar6 >> 0x40,0);
          (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(B,lVar5,lVar2,&local_b8);
          local_80 = lVar2 + 1;
          this = local_88;
        } while (local_80 <
                 (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol);
      }
      bVar1 = 1 < local_90;
      local_90 = lVar5;
    } while (bVar1);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt){
		Error("TPZMatrix::Subst_LBackward incompatible dimensions \n");
	}
	
    for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
        for ( int64_t c = 0; c < B->Cols(); c++ ) {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
            //
            TVar sum = 0.0;
            for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = B[r,c] - sum.
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}